

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitMemoryGrow
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,MemoryGrow *curr)

{
  Name memory_00;
  Name memory_01;
  bool bVar1;
  uint uVar2;
  ExpressionRunner<wasm::ModuleRunner> *this_00;
  long lVar3;
  address64_t aVar4;
  ulong uVar5;
  ExternalInterface *pEVar6;
  Name NVar7;
  Literal local_220;
  Address local_208;
  Address local_200;
  ModuleRunner *local_1f8;
  size_t sStack_1f0;
  Literal local_1e0;
  ulong local_1c8;
  uint64_t newSize;
  Literal local_1a8;
  BasicType local_18c;
  ulong local_188;
  uint64_t maxAddr;
  uint64_t delta;
  Literal local_170;
  undefined1 local_158 [8];
  Flow ret;
  undefined1 local_108 [8];
  Literal fail;
  Type addressType;
  Memory *memory;
  Address local_b0;
  Address memorySize;
  undefined1 local_90 [8];
  MemoryInstanceInfo info;
  undefined1 local_68 [8];
  Flow flow;
  MemoryGrow *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  flow.breakTo.super_IString.str._M_str = (char *)curr;
  this_00 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_68,this_00,*(Expression **)(flow.breakTo.super_IString.str._M_str + 0x10)
            );
  bVar1 = Flow::breaking((Flow *)local_68);
  if (bVar1) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
    info.name.super_IString.str._M_str._0_4_ = 1;
  }
  else {
    memorySize.addr = (((IString *)(flow.breakTo.super_IString.str._M_str + 0x18))->str)._M_len;
    getMemoryInstanceInfo
              ((MemoryInstanceInfo *)local_90,this,
               (Name)((IString *)(flow.breakTo.super_IString.str._M_str + 0x18))->str);
    memory_01.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
    memory_01.super_IString.str._M_len = (size_t)info.instance;
    local_b0 = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_90,memory_01);
    NVar7.super_IString.str._M_str = (char *)info.instance;
    NVar7.super_IString.str._M_len = (size_t)*(Module **)((long)local_90 + 0x20);
    lVar3 = ::wasm::Module::getMemory(NVar7);
    fail.type.id = *(uintptr_t *)(lVar3 + 0x50);
    ret.breakTo.super_IString.str._M_str = *(char **)(lVar3 + 0x50);
    wasm::Literal::makeFromInt64((Literal *)local_108,-1,(Type)ret.breakTo.super_IString.str._M_str)
    ;
    aVar4 = Address::operator_cast_to_unsigned_long(&local_b0);
    delta = fail.type.id;
    wasm::Literal::makeFromInt64(&local_170,aVar4,fail.type);
    Flow::Flow((Flow *)local_158,&local_170);
    ::wasm::Literal::~Literal(&local_170);
    Flow::getSingleValue((Flow *)local_68);
    maxAddr = ::wasm::Literal::getUnsigned();
    local_18c = i32;
    bVar1 = Type::operator==(&fail.type,&local_18c);
    uVar2 = std::numeric_limits<unsigned_int>::max();
    local_188 = std::numeric_limits<unsigned_long>::max();
    if (bVar1) {
      local_188 = (ulong)uVar2;
    }
    if (local_188 >> 0x10 < maxAddr) {
      ::wasm::Literal::Literal(&local_1a8,(Literal *)local_108);
      Flow::Flow(__return_storage_ptr__,&local_1a8);
      ::wasm::Literal::~Literal(&local_1a8);
    }
    else {
      aVar4 = Address::operator_cast_to_unsigned_long(&local_b0);
      if (aVar4 < local_188 - maxAddr) {
        aVar4 = Address::operator_cast_to_unsigned_long(&local_b0);
        uVar5 = aVar4 + maxAddr;
        local_1c8 = uVar5;
        aVar4 = Address::operator_cast_to_unsigned_long((Address *)(lVar3 + 0x40));
        if (aVar4 < uVar5) {
          ::wasm::Literal::Literal(&local_1e0,(Literal *)local_108);
          Flow::Flow(__return_storage_ptr__,&local_1e0);
          ::wasm::Literal::~Literal(&local_1e0);
        }
        else {
          pEVar6 = MemoryInstanceInfo::interface((MemoryInstanceInfo *)local_90);
          local_1f8 = info.instance;
          sStack_1f0 = info.name.super_IString.str._M_len;
          aVar4 = Address::operator_cast_to_unsigned_long(&local_b0);
          Address::Address(&local_200,aVar4 << 0x10);
          Address::Address(&local_208,local_1c8 << 0x10);
          uVar2 = (*pEVar6->_vptr_ExternalInterface[6])
                            (pEVar6,local_1f8,sStack_1f0,local_200.addr,local_208.addr);
          if ((uVar2 & 1) == 0) {
            ::wasm::Literal::Literal(&local_220,(Literal *)local_108);
            Flow::Flow(__return_storage_ptr__,&local_220);
            ::wasm::Literal::~Literal(&local_220);
          }
          else {
            Address::operator=(&local_b0,local_1c8);
            memory_00.super_IString.str._M_str = (char *)info.name.super_IString.str._M_len;
            memory_00.super_IString.str._M_len = (size_t)info.instance;
            setMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_90,memory_00,local_b0);
            Flow::Flow(__return_storage_ptr__,(Flow *)local_158);
          }
        }
      }
      else {
        ::wasm::Literal::Literal((Literal *)&newSize,(Literal *)local_108);
        Flow::Flow(__return_storage_ptr__,(Literal *)&newSize);
        ::wasm::Literal::~Literal((Literal *)&newSize);
      }
    }
    info.name.super_IString.str._M_str._0_4_ = 1;
    Flow::~Flow((Flow *)local_158);
    ::wasm::Literal::~Literal((Literal *)local_108);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitMemoryGrow(MemoryGrow* curr) {
    NOTE_ENTER("MemoryGrow");
    Flow flow = self()->visit(curr->delta);
    if (flow.breaking()) {
      return flow;
    }
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    auto* memory = info.instance->wasm.getMemory(info.name);
    auto addressType = memory->addressType;
    auto fail = Literal::makeFromInt64(-1, memory->addressType);
    Flow ret = Literal::makeFromInt64(memorySize, addressType);
    uint64_t delta = flow.getSingleValue().getUnsigned();
    uint64_t maxAddr = addressType == Type::i32
                         ? std::numeric_limits<uint32_t>::max()
                         : std::numeric_limits<uint64_t>::max();
    if (delta > maxAddr / Memory::kPageSize) {
      // Impossible to grow this much.
      return fail;
    }
    if (memorySize >= maxAddr - delta) {
      // Overflow.
      return fail;
    }
    auto newSize = memorySize + delta;
    if (newSize > memory->max) {
      return fail;
    }
    if (!info.interface()->growMemory(info.name,
                                      memorySize * Memory::kPageSize,
                                      newSize * Memory::kPageSize)) {
      // We failed to grow the memory in practice, even though it was valid
      // to try to do so.
      return fail;
    }
    memorySize = newSize;
    info.instance->setMemorySize(info.name, memorySize);
    return ret;
  }